

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

bool __thiscall
tinyusdz::Stage::find_prim_at_path(Stage *this,Path *path,int64_t *prim_id,string *err)

{
  byte bVar1;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  undefined1 local_40 [32];
  bool local_20;
  
  if (prim_id == (int64_t *)0x0) {
    if (err == (string *)0x0) {
      bVar1 = 0;
    }
    else {
      bVar1 = 0;
      ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x3e8b65);
    }
  }
  else {
    GetPrimAtPath_abi_cxx11_
              ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40,this,path);
    bVar1 = local_20;
    if (local_20 == true) {
      *prim_id = *(int64_t *)(local_40._0_8_ + 0x318);
    }
    else if (err != (string *)0x0) {
      ::std::__cxx11::string::_M_assign((string *)err);
    }
    if (((local_20 & 1U) == 0) && ((value_type)local_40._0_8_ != (value_type)(local_40 + 0x10))) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
    }
  }
  return (bool)bVar1;
}

Assistant:

bool Stage::find_prim_at_path(const Path &path, int64_t *prim_id,
                              std::string *err) const {
  if (!prim_id) {
    if (err) {
      (*err) = "`prim_id` argument is nullptr.\n";
    }
    return false;
  }

  nonstd::expected<const Prim *, std::string> ret = GetPrimAtPath(path);
  if (ret) {
    (*prim_id) = ret.value()->prim_id();
    return true;
  } else {
    if (err) {
      (*err) = ret.error();
    }
    return false;
  }
}